

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

double * __thiscall sptk::Matrix::At(Matrix *this,int row,int column)

{
  out_of_range *this_00;
  
  if ((((-1 < row) && (-1 < column)) && (row < this->num_row_)) && (column < this->num_column_)) {
    return (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
           super__Vector_impl_data._M_start[(uint)row] + (uint)column;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Matrix: Out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const double& Matrix::At(int row, int column) const {
  if (row < 0 || num_row_ <= row || column < 0 || num_column_ <= column) {
    throw std::out_of_range(kErrorMessageForOutOfRange);
  }
  return index_[row][column];
}